

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O3

nh_topten_entry *
nh_get_topten(int *out_len,char *statusbuf,char *player,int top,int around,boolean own)

{
  xchar xVar1;
  uint uVar2;
  uint uVar3;
  char *__s1;
  toptenentry *__dest;
  undefined1 *__ptr;
  ulong uVar4;
  nh_topten_entry *__s;
  int iVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  toptenentry *__s1_00;
  bool bVar10;
  bool bVar11;
  toptenentry newtt;
  toptenentry local_f0;
  
  xVar1 = dungeon_topology.d_wiz1_level.dlevel;
  bVar10 = true;
  if ((dungeon_topology.d_wiz1_level.dlevel != '\0') && (moves != 0)) {
    bVar10 = program_state.gameover == 0;
  }
  *statusbuf = '\0';
  *out_len = 0;
  iVar5 = exit_jmp_buf_valid + 1;
  bVar11 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar5;
  if ((bVar11) && (iVar5 = __sigsetjmp(exit_jmp_buf), iVar5 != 0)) {
    __s = (nh_topten_entry *)0x0;
  }
  else {
    if (xVar1 == '\0') {
      dlb_init();
      init_dungeons();
    }
    if (bVar10) {
      __s1 = "";
    }
    else {
      __s1 = plname;
    }
    if (player != (char *)0x0) {
      __s1 = player;
    }
    iVar5 = open_datafile("record",0,2);
    __dest = read_topten(iVar5,10000);
    close(iVar5);
    if (__dest == (toptenentry *)0x0) {
      builtin_strncpy(statusbuf,"Cannot open record file!",0x19);
      __s = (nh_topten_entry *)0x0;
    }
    else {
      uVar2 = 0xffffffff;
      if ((!bVar10) && (iVar5 = strcmp(__s1,plname), iVar5 == 0)) {
        fill_topten_entry(&local_f0,end_how);
        uVar2 = 0xffffffff;
        lVar7 = 0;
        __s1_00 = __dest;
        do {
          if ((__s1_00->points < 1) && (__s1_00->deathlev == 0)) break;
          iVar5 = bcmp(__s1_00,&local_f0,0xc0);
          if (iVar5 == 0) {
            uVar2 = (uint)lVar7;
          }
          lVar7 = lVar7 + 1;
          __s1_00 = __s1_00 + 1;
        } while (lVar7 != 10000);
        if (flags.explore == '\0' && flags.debug == '\0') {
          if (uVar2 < 10) {
            builtin_strncpy(statusbuf,"You made the top ten list!",0x1b);
          }
          else {
            pcVar8 = ordin(uVar2 + 1);
            sprintf(statusbuf,"You reached the %d%s place on the score list.",(ulong)(uVar2 + 1),
                    pcVar8);
          }
        }
        else {
          pcVar8 = "discover";
          if (flags.debug != '\0') {
            pcVar8 = "wizard";
          }
          sprintf(statusbuf,"Since you were in %s mode, your game was not added to the score list.",
                  pcVar8);
        }
      }
      __ptr = (undefined1 *)calloc(10000,1);
      pcVar8 = __dest->name;
      uVar4 = 0;
      uVar9 = uVar4;
      do {
        uVar6 = (uint)uVar4;
        if ((((toptenentry *)(pcVar8 + -0x4c))->points < 1) && (*(int *)(pcVar8 + -0x44) == 0))
        break;
        if (top == -1 || (long)uVar9 < (long)top) {
          __ptr[uVar9] = 1;
        }
        if ((own != '\0') && (iVar5 = strcmp(__s1,pcVar8), iVar5 == 0)) {
          __ptr[uVar9] = 1;
        }
        if (((uVar2 == 0xffffffff) || ((long)uVar9 < (long)(int)(uVar2 - around))) ||
           ((long)(int)(around + uVar2) < (long)uVar9)) {
          uVar3 = (uint)(__ptr[uVar9] != '\0');
        }
        else {
          __ptr[uVar9] = 1;
          uVar3 = 1;
        }
        uVar6 = uVar6 + uVar3;
        uVar9 = uVar9 + 1;
        pcVar8 = pcVar8 + 0xc0;
        uVar4 = (ulong)uVar6;
      } while (uVar9 != 10000);
      bVar11 = uVar6 == 0;
      if (!bVar10 && bVar11) {
        memcpy(__dest,&local_f0,0xc0);
        *__ptr = 1;
        uVar6 = 1;
      }
      __s = (nh_topten_entry *)xmalloc((int)((long)(int)uVar6 * 0x298));
      memset(__s,0,(long)(int)uVar6 * 0x298);
      *out_len = uVar6;
      uVar9 = 0;
      iVar5 = 0;
      do {
        if ((__dest[uVar9].points < 1) && (__dest[uVar9].deathlev == 0)) break;
        if (__ptr[uVar9] != '\0') {
          lVar7 = (long)iVar5;
          iVar5 = iVar5 + 1;
          fill_nh_score_entry(__dest + uVar9,__s + lVar7,(int)uVar9 + 1,uVar9 == uVar2);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != 10000);
      if (!bVar10 && bVar11) {
        __s->rank = -1;
        __s->highlight = '\x01';
      }
      if (xVar1 == '\0') {
        free_dungeon();
        dlb_cleanup();
      }
      free(__ptr);
      free(__dest);
    }
    exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
  }
  return __s;
}

Assistant:

struct nh_topten_entry *nh_get_topten(int *out_len, char *statusbuf,
				      const char *player, int top, int around, boolean own)
{
    struct toptenentry *ttlist, newtt;
    struct nh_topten_entry *score_list;
    boolean game_inited = (wiz1_level.dlevel != 0);
    boolean game_complete = game_inited && moves && program_state.gameover;
    int rank = -1; /* index of the completed game in the topten list */
    int fd, i, j, sel_count;
    boolean *selected, off_list = FALSE;
    
    statusbuf[0] = '\0';
    *out_len = 0;
    
    if (!api_entry_checkpoint())
	return NULL;
    
    if (!game_inited) {
	/* If nh_get_topten() isn't called after a game, we never went through
	 * initialization. */
	dlb_init();
	init_dungeons();
    }
    
    if (!player) {
	if (game_complete)
	    player = plname;
	else
	    player = "";
    }
    
    fd = open_datafile(RECORD, O_RDONLY, SCOREPREFIX);
    ttlist = read_topten(fd, TTLISTLEN);
    close(fd);
    if (!ttlist) {
	strcpy(statusbuf, "Cannot open record file!");
	api_exit();
	return NULL;
    }
    
    /* find the rank of a completed game in the score list */
    if (game_complete && !strcmp(player, plname)) {
	fill_topten_entry(&newtt, end_how);
	
	/* find this entry in the list */
	for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++)
	    if (!memcmp(&ttlist[i], &newtt, sizeof(struct toptenentry)))
		rank = i;
	
	if (wizard || discover)
	    sprintf(statusbuf, "Since you were in %s mode, your game was not "
	            "added to the score list.", wizard ? "wizard" : "discover");
	else if (rank >= 0 && rank < 10)
	    sprintf(statusbuf, "You made the top ten list!");
	else if (rank)
	    sprintf(statusbuf, "You reached the %d%s place on the score list.",
		    rank+1, ordin(rank+1));
    }
    
    /* select scores for display */
    sel_count = 0;
    selected = calloc(TTLISTLEN, sizeof(boolean));
    
    for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++) {
	if (top == -1 || i < top)
	    selected[i] = TRUE;
	
	if (own && !strcmp(player, ttlist[i].name))
	    selected[i] = TRUE;
	
	if (rank != -1 && rank - around <= i && i <= rank + around)
	    selected[i] = TRUE;
	
	if (selected[i])
	    sel_count++;
    }
    
    if (game_complete && sel_count == 0) {
	/* didn't make it onto the list and nothing else is selected */
	ttlist[0] = newtt;
	selected[0] = TRUE;
	sel_count++;
	off_list = TRUE;
    }
    
    
    score_list = xmalloc(sel_count * sizeof(struct nh_topten_entry));
    memset(score_list, 0, sel_count * sizeof(struct nh_topten_entry));
    *out_len = sel_count;
    j = 0;
    for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++) {
	if (selected[i])
	    fill_nh_score_entry(&ttlist[i], &score_list[j++], i+1, i == rank);
    }
    
    if (off_list) {
	score_list[0].rank = -1;
	score_list[0].highlight = TRUE;
    }
    
    if (!game_inited) {
	    free_dungeon();
	    dlb_cleanup();
    }
    
    free(selected);
    free(ttlist);
    
    api_exit();
    return score_list;
}